

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O0

Mat * __thiscall ncnn::ModelBin::load(ModelBin *this,int w,int h,int type)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  long *in_RSI;
  Mat *in_RDI;
  int in_R8D;
  Mat m;
  bool local_e9;
  void *local_d8;
  int *local_d0;
  size_t local_c8;
  int local_c0;
  Allocator *local_b8;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  Allocator *in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff70;
  
  (**(code **)(*in_RSI + 0x10))(&local_d8,in_RSI,in_EDX * in_ECX,in_R8D);
  local_e9 = local_d8 == (void *)0x0 || (long)in_stack_ffffffffffffff68 * (long)local_a0 == 0;
  if (local_e9) {
    in_RDI->data = local_d8;
    in_RDI->refcount = local_d0;
    in_RDI->elemsize = local_c8;
    in_RDI->elempack = local_c0;
    in_RDI->allocator = local_b8;
    in_RDI->dims = local_b0;
    in_RDI->w = local_ac;
    in_RDI->h = local_a8;
    in_RDI->d = local_a4;
    in_RDI->c = local_a0;
    in_RDI->cstep = (size_t)in_stack_ffffffffffffff68;
    if (in_RDI->refcount != (int *)0x0) {
      LOCK();
      *in_RDI->refcount = *in_RDI->refcount + 1;
      UNLOCK();
    }
  }
  else {
    Mat::reshape((Mat *)CONCAT44(in_EDX,in_ECX),in_R8D,in_stack_ffffffffffffff70,
                 in_stack_ffffffffffffff68);
  }
  if (local_d0 != (int *)0x0) {
    LOCK();
    iVar1 = *local_d0;
    *local_d0 = *local_d0 + -1;
    UNLOCK();
    if (iVar1 == 1) {
      if (local_b8 == (Allocator *)0x0) {
        if (local_d8 != (void *)0x0) {
          free(local_d8);
        }
      }
      else {
        (*local_b8->_vptr_Allocator[3])(local_b8,local_d8);
      }
    }
  }
  return in_RDI;
}

Assistant:

Mat ModelBin::load(int w, int h, int type) const
{
    Mat m = load(w * h, type);
    if (m.empty())
        return m;

    return m.reshape(w, h);
}